

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O0

int bp_decode_ms_min_synd
              (mod2sparse *H,char *synd,double error_prob,int max_iter,int *converge,int *iter,
              char *decoding,double *log_prob_ratios)

{
  int len;
  int iVar1;
  uint n;
  double *log_prob_ratios_00;
  void *__ptr;
  undefined4 *in_RCX;
  int in_EDX;
  char *in_RSI;
  int *in_RDI;
  int *in_R8;
  double *unaff_retaddr;
  int check_no;
  int hamming_weight_min;
  int synd_weight;
  int decreased;
  double *log_prob_ratios_save;
  char *candidate_synd;
  int hamming_weight;
  int it;
  int N;
  int M;
  char *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  int iVar2;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  int in_stack_fffffffffffffffc;
  
  len = *in_RDI;
  iVar1 = in_RDI[1];
  iVar2 = 0;
  n = bin_char_weight(in_RSI,len);
  uVar3 = n;
  log_prob_ratios_00 = (double *)chk_alloc(n,in_stack_ffffffffffffff90);
  __ptr = chk_alloc(n,in_stack_ffffffffffffff90);
  bp_setup_ms((mod2sparse *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              (double)__ptr,log_prob_ratios_00,(char *)CONCAT44(iVar2,uVar3));
  iVar4 = 0;
  while( true ) {
    if (in_EDX <= iVar4) {
      if (iVar2 != 0) {
        memcpy(_check_no,log_prob_ratios_00,(long)iVar1 << 3);
      }
      free(__ptr);
      free(log_prob_ratios_00);
      *in_R8 = iVar4;
      *in_RCX = 0;
      return 0;
    }
    bp_update_ms(_synd_weight,_check_no,unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_RDI);
    syndrome((mod2sparse *)CONCAT44(n,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
             (char *)0x16d575);
    uVar3 = 0;
    for (in_stack_ffffffffffffff90 = 0; (int)in_stack_ffffffffffffff90 < len;
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
      uVar3 = (int)(char)(in_RSI[(int)in_stack_ffffffffffffff90] ^
                         *(byte *)((long)__ptr + (long)(int)in_stack_ffffffffffffff90)) + uVar3;
    }
    if (uVar3 == 0) break;
    if ((int)uVar3 < (int)n) {
      memcpy(log_prob_ratios_00,_check_no,(long)iVar1 << 3);
      iVar2 = 1;
      n = uVar3;
    }
    iVar4 = iVar4 + 1;
  }
  free(__ptr);
  free(log_prob_ratios_00);
  *in_R8 = iVar4;
  *in_RCX = 1;
  return 1;
}

Assistant:

int bp_decode_ms_min_synd(
        mod2sparse *H,
        char *synd,
        double error_prob,
        int max_iter,
        int *converge,
        int *iter,
        char *decoding,
        double *log_prob_ratios)
{

    int M,N;
    int it;
    M = mod2sparse_rows(H);
    N = mod2sparse_cols(H);
    int hamming_weight;
    char *candidate_synd;
    double *log_prob_ratios_save;

    int decreased=0;

    int synd_weight=bin_char_weight(synd,M);
    int hamming_weight_min=synd_weight;

    log_prob_ratios_save=chk_alloc(N,sizeof(*log_prob_ratios_save));
    candidate_synd=chk_alloc(M,sizeof(*candidate_synd));

    bp_setup_ms(H,error_prob,log_prob_ratios,decoding);

    for(it=0; it<max_iter;it++)
    {
        bp_update_ms(H,synd, log_prob_ratios, it, decoding);
        syndrome(H,decoding,candidate_synd);

        hamming_weight=0;
        for(int check_no=0;check_no<M;check_no++)
        {
            hamming_weight+=synd[check_no]^candidate_synd[check_no];
        }

        if(hamming_weight==0)
        {
            free(candidate_synd);
            free(log_prob_ratios_save);
            *iter=it;
            *converge=1;
            return 1;
        }


        if(hamming_weight<hamming_weight_min){
            hamming_weight_min=hamming_weight;
            memcpy(log_prob_ratios_save,log_prob_ratios,N*sizeof(*log_prob_ratios));
            decreased=1;
        }

    }

    if(decreased) memcpy(log_prob_ratios,log_prob_ratios_save,N*sizeof(*log_prob_ratios));


    free(candidate_synd);
    free(log_prob_ratios_save);
    *iter=it;
    *converge=0;
    return 0;
}